

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Base.cpp
# Opt level: O2

uint16_t __thiscall CPU::WDC65816::ProcessorBase::value_of(ProcessorBase *this,Register r)

{
  byte bVar1;
  
  switch(r) {
  case LastOperationAddress:
    return (this->super_ProcessorStorage).last_operation_pc_;
  case ProgramCounter:
    return (this->super_ProcessorStorage).registers_.pc;
  case StackPointer:
    return (this->super_ProcessorStorage).registers_.s.full;
  case Flags:
    bVar1 = ProcessorStorage::get_flags(&this->super_ProcessorStorage);
    return (uint16_t)bVar1;
  case A:
    return (this->super_ProcessorStorage).registers_.a.full;
  case X:
    return (this->super_ProcessorStorage).registers_.x.full;
  case Y:
    return (this->super_ProcessorStorage).registers_.y.full;
  case EmulationFlag:
    return (uint16_t)(this->super_ProcessorStorage).registers_.emulation_flag;
  case DataBank:
    return *(uint16_t *)((long)&(this->super_ProcessorStorage).registers_.data_bank + 2);
  case ProgramBank:
    return *(uint16_t *)((long)&(this->super_ProcessorStorage).registers_.program_bank + 2);
  case Direct:
    return (this->super_ProcessorStorage).registers_.direct;
  default:
    return 0;
  }
}

Assistant:

uint16_t ProcessorBase::value_of(Register r) const {
	switch (r) {
		case Register::ProgramCounter:			return registers_.pc;
		case Register::LastOperationAddress:	return last_operation_pc_;
		case Register::StackPointer:			return registers_.s.full;
		case Register::Flags:					return get_flags();
		case Register::A:						return registers_.a.full;
		case Register::X:						return registers_.x.full;
		case Register::Y:						return registers_.y.full;
		case Register::EmulationFlag:			return registers_.emulation_flag;
		case Register::DataBank:				return registers_.data_bank >> 16;
		case Register::ProgramBank:				return registers_.program_bank >> 16;
		case Register::Direct:					return registers_.direct;
		default: return 0;
	}
}